

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O0

int __thiscall ON_BezierCurve::GetNurbForm(ON_BezierCurve *this,ON_NurbsCurve *n)

{
  bool bVar1;
  int iVar2;
  double *__dest;
  double *__src;
  int local_24;
  int i;
  int sizeof_cv;
  int rc;
  ON_NurbsCurve *n_local;
  ON_BezierCurve *this_local;
  
  i = 0;
  bVar1 = ON_NurbsCurve::Create(n,this->m_dim,this->m_is_rat != 0,this->m_order,this->m_order);
  if (bVar1) {
    iVar2 = CVSize(this);
    for (local_24 = 0; local_24 < this->m_order; local_24 = local_24 + 1) {
      __dest = ON_NurbsCurve::CV(n,local_24);
      __src = CV(this,local_24);
      memcpy(__dest,__src,(long)(iVar2 << 3));
    }
    n->m_knot[this->m_order + -2] = 0.0;
    n->m_knot[this->m_order + -1] = 1.0;
    bVar1 = ON_ClampKnotVector(n->m_order,n->m_cv_count,n->m_knot,2);
    i = (int)bVar1;
  }
  return i;
}

Assistant:

int ON_BezierCurve::GetNurbForm( ON_NurbsCurve& n ) const
{
  int rc = 0;
  if ( n.Create( m_dim, m_is_rat, m_order, m_order ) ) {
    const int sizeof_cv = CVSize()*sizeof(m_cv[0]);
    int i;
    for ( i = 0; i < m_order; i++ ) {
      memcpy( n.CV(i), CV(i), sizeof_cv );
    }
    n.m_knot[m_order-2] = 0.0;//m_domain.Min();
    n.m_knot[m_order-1] = 1.0;//m_domain.Max();
    rc = ON_ClampKnotVector(n.m_order, n.m_cv_count, n.m_knot, 2) ? 1 : 0;
  }
  return rc;
}